

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_5,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  undefined8 *puVar4;
  float *pfVar5;
  int col;
  long lVar6;
  Vector<float,_2> *pVVar7;
  int col_1;
  bool bVar8;
  float v;
  undefined4 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float afStack_88 [2];
  Matrix<float,_2,_4> res;
  undefined1 auStack_58 [8];
  Type in1;
  Type in0;
  int aiStack_20 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in1.m_data.m_data[3].m_data[0] = evalCtx->in[0].m_data[0];
    in1.m_data.m_data[3].m_data[1] = evalCtx->in[0].m_data[1];
  }
  else {
    in1.m_data.m_data[3].m_data[0] = -0.1;
    in1.m_data.m_data[3].m_data[1] = -0.2;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    puVar4 = (undefined8 *)auStack_58;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      lVar6 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar9 = 0;
        }
        *(undefined4 *)(puVar4 + lVar6) = uVar9;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar3 = 1;
      puVar4 = (undefined8 *)((long)auStack_58 + 4);
      bVar1 = false;
    } while (bVar2);
    auStack_58 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in1.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    auStack_58 = (undefined1  [8])0x0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    lVar3 = 0;
    puVar4 = (undefined8 *)auStack_58;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      lVar6 = 0;
      do {
        *(undefined4 *)(puVar4 + lVar6) = *(undefined4 *)((long)&DAT_00b1fa20 + lVar6 * 4 + lVar3);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar3 = 0x10;
      puVar4 = (undefined8 *)((long)auStack_58 + 4);
      bVar1 = false;
    } while (bVar2);
  }
  res.m_data.m_data[2].m_data[0] = 0.0;
  res.m_data.m_data[2].m_data[1] = 0.0;
  afStack_88[0] = 0.0;
  afStack_88[1] = 0.0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  pfVar5 = afStack_88;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar6 = 0;
    do {
      fVar10 = 1.0;
      if (lVar3 != lVar6) {
        fVar10 = 0.0;
      }
      pfVar5[lVar6 * 2] = fVar10;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar3 = 1;
    pfVar5 = afStack_88 + 1;
    bVar1 = false;
  } while (bVar2);
  pfVar5 = afStack_88;
  pVVar7 = in1.m_data.m_data + 3;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar3 = 0;
    do {
      fVar10 = 0.0;
      lVar6 = 0;
      bVar1 = true;
      do {
        bVar8 = bVar1;
        fVar10 = fVar10 + pVVar7[lVar6].m_data[0] * in1.m_data.m_data[lVar3 + -1].m_data[lVar6];
        lVar6 = 1;
        bVar1 = false;
      } while (bVar8);
      pfVar5[lVar3 * 2] = fVar10;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    pfVar5 = afStack_88 + 1;
    pVVar7 = (Vector<float,_2> *)(in1.m_data.m_data[3].m_data + 1);
    bVar1 = false;
  } while (bVar2);
  fVar11 = res.m_data.m_data[2].m_data[0] + afStack_88[0] + afStack_88[1];
  fVar12 = res.m_data.m_data[2].m_data[1] +
           res.m_data.m_data[0].m_data[1] + res.m_data.m_data[0].m_data[0];
  res.m_data.m_data[3].m_data[0] = fVar11;
  res.m_data.m_data[3].m_data[1] = fVar12;
  aiStack_20[2] = 0;
  aiStack_20[3] = 1;
  aiStack_20[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_20[lVar3]] = res.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}